

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::abstract_value<bool>::abstract_value
          (abstract_value<bool> *this,abstract_value<bool> *rhs)

{
  bool bVar1;
  element_type *peVar2;
  long in_RSI;
  undefined8 *in_RDI;
  shared_ptr<bool> *in_stack_ffffffffffffffa8;
  Value *in_stack_ffffffffffffffb0;
  shared_ptr<bool> *this_00;
  
  Value::Value(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__abstract_value_00187968;
  this_00 = (shared_ptr<bool> *)(in_RDI + 3);
  std::shared_ptr<bool>::shared_ptr((shared_ptr<bool> *)0x15abde);
  in_RDI[5] = 0;
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x31) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 7));
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x18));
  if (bVar1) {
    std::make_shared<bool>();
    std::shared_ptr<bool>::operator=(this_00,in_stack_ffffffffffffffa8);
    std::shared_ptr<bool>::~shared_ptr((shared_ptr<bool> *)0x15ac51);
    peVar2 = std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 3));
    in_RDI[5] = peVar2;
  }
  else {
    in_RDI[5] = *(undefined8 *)(in_RSI + 0x28);
  }
  *(byte *)(in_RDI + 6) = *(byte *)(in_RSI + 0x30) & 1;
  *(byte *)((long)in_RDI + 0x31) = *(byte *)(in_RSI + 0x31) & 1;
  std::__cxx11::string::operator=((string *)(in_RDI + 7),(string *)(in_RSI + 0x38));
  std::__cxx11::string::operator=((string *)(in_RDI + 0xb),(string *)(in_RSI + 0x58));
  return;
}

Assistant:

abstract_value(const abstract_value& rhs)
      {
        if (rhs.m_result)
        {
          m_result = std::make_shared<T>();
          m_store = m_result.get();
        }
        else
        {
          m_store = rhs.m_store;
        }

        m_default = rhs.m_default;
        m_implicit = rhs.m_implicit;
        m_default_value = rhs.m_default_value;
        m_implicit_value = rhs.m_implicit_value;
      }